

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O2

void __thiscall
CoreML::Specification::InnerProductLayerParams::SerializeWithCachedSizes
          (InnerProductLayerParams *this,CodedOutputStream *output)

{
  if (this->inputchannels_ != 0) {
    google::protobuf::internal::WireFormatLite::WriteUInt64(1,this->inputchannels_,output);
  }
  if (this->outputchannels_ != 0) {
    google::protobuf::internal::WireFormatLite::WriteUInt64(2,this->outputchannels_,output);
  }
  if (this->hasbias_ == true) {
    google::protobuf::internal::WireFormatLite::WriteBool(10,true,output);
  }
  if (this->weights_ != (WeightParams *)0x0 &&
      this != (InnerProductLayerParams *)&_InnerProductLayerParams_default_instance_) {
    google::protobuf::internal::WireFormatLite::WriteMessage
              (0x14,&this->weights_->super_MessageLite,output);
  }
  if (this->bias_ != (WeightParams *)0x0 &&
      this != (InnerProductLayerParams *)&_InnerProductLayerParams_default_instance_) {
    google::protobuf::internal::WireFormatLite::WriteMessage
              (0x15,&this->bias_->super_MessageLite,output);
  }
  if (this->int8dynamicquantize_ == true) {
    google::protobuf::internal::WireFormatLite::WriteBool(0x16,true,output);
    return;
  }
  return;
}

Assistant:

void InnerProductLayerParams::SerializeWithCachedSizes(
    ::google::protobuf::io::CodedOutputStream* output) const {
  // @@protoc_insertion_point(serialize_start:CoreML.Specification.InnerProductLayerParams)
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  // uint64 inputChannels = 1;
  if (this->inputchannels() != 0) {
    ::google::protobuf::internal::WireFormatLite::WriteUInt64(1, this->inputchannels(), output);
  }

  // uint64 outputChannels = 2;
  if (this->outputchannels() != 0) {
    ::google::protobuf::internal::WireFormatLite::WriteUInt64(2, this->outputchannels(), output);
  }

  // bool hasBias = 10;
  if (this->hasbias() != 0) {
    ::google::protobuf::internal::WireFormatLite::WriteBool(10, this->hasbias(), output);
  }

  // .CoreML.Specification.WeightParams weights = 20;
  if (this->has_weights()) {
    ::google::protobuf::internal::WireFormatLite::WriteMessage(
      20, *this->weights_, output);
  }

  // .CoreML.Specification.WeightParams bias = 21;
  if (this->has_bias()) {
    ::google::protobuf::internal::WireFormatLite::WriteMessage(
      21, *this->bias_, output);
  }

  // bool int8DynamicQuantize = 22;
  if (this->int8dynamicquantize() != 0) {
    ::google::protobuf::internal::WireFormatLite::WriteBool(22, this->int8dynamicquantize(), output);
  }

  // @@protoc_insertion_point(serialize_end:CoreML.Specification.InnerProductLayerParams)
}